

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::GetSourceFiles
          (cmTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files,
          string *config)

{
  pointer *pppcVar1;
  cmTargetInternals *pcVar2;
  iterator __position;
  iterator iVar3;
  mapped_type *this_00;
  pointer sourceName;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar4;
  cmSourceFile *sf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  string key;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  cmSourceFile *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_78;
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  local_58;
  
  cmsys::SystemTools::UpperCase(&local_78,config);
  pcVar2 = (this->Internal).Pointer;
  if (this->LinkImplementationLanguageIsContextDependent == false) {
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::operator=
              (files,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                     ((pcVar2->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     + 2));
  }
  else {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
            ::find(&(pcVar2->SourceFilesMap)._M_t,&local_78);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(((this->Internal).Pointer)->SourceFilesMap)._M_t._M_impl.super__Rb_tree_header) {
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetSourceFiles(this,&local_98,config);
      local_58._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_58._M_impl.super__Rb_tree_header._M_header;
      local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_58._M_impl.super__Rb_tree_header._M_header._M_right =
           local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        sourceName = local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_a0 = cmMakefile::GetOrCreateSource(this->Makefile,sourceName,false);
          pVar4 = std::
                  _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                  ::_M_insert_unique<cmSourceFile*const&>
                            ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                              *)&local_58,&local_a0);
          if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __position._M_current =
                 (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
              _M_realloc_insert<cmSourceFile*const&>
                        ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)files,__position,
                         &local_a0);
            }
            else {
              *__position._M_current = local_a0;
              pppcVar1 = &(files->
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppcVar1 = *pppcVar1 + 1;
            }
          }
          sourceName = sourceName + 1;
        } while (sourceName !=
                 local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[](&((this->Internal).Pointer)->SourceFilesMap,&local_78);
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::operator=(this_00,files);
      std::
      _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
      ::~_Rb_tree(&local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
    }
    else {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::operator=
                (files,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                       (iVar3._M_node + 2));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTarget::GetSourceFiles(std::vector<cmSourceFile*> &files,
                              const std::string& config) const
{

  // Lookup any existing link implementation for this configuration.
  std::string key = cmSystemTools::UpperCase(config);

  if(!this->LinkImplementationLanguageIsContextDependent)
    {
    files = this->Internal->SourceFilesMap.begin()->second;
    return;
    }

  cmTargetInternals::SourceFilesMapType::iterator
    it = this->Internal->SourceFilesMap.find(key);
  if(it != this->Internal->SourceFilesMap.end())
    {
    files = it->second;
    }
  else
    {
    std::vector<std::string> srcs;
    this->GetSourceFiles(srcs, config);

    std::set<cmSourceFile*> emitted;

    for(std::vector<std::string>::const_iterator i = srcs.begin();
        i != srcs.end(); ++i)
      {
      cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
      if (emitted.insert(sf).second)
        {
        files.push_back(sf);
        }
      }
    this->Internal->SourceFilesMap[key] = files;
    }
}